

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_getFrameHeader_advanced
                 (ZSTD_frameHeader *zfhPtr,void *src,size_t srcSize,ZSTD_format_e format)

{
  byte bVar1;
  byte bVar2;
  size_t sVar3;
  ulong uVar4;
  uint uVar5;
  ZSTD_format_e format_00;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  
  if (ZSTD_f_zstd1_magicless < format) {
    __assert_fail("(format == ZSTD_f_zstd1) || (format == ZSTD_f_zstd1_magicless)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x5a00,"size_t ZSTD_startingInputLength(ZSTD_format_e)");
  }
  lVar6 = (ulong)(format == ZSTD_f_zstd1) * 4;
  uVar8 = lVar6 + 1;
  zfhPtr->frameContentSize = 0;
  zfhPtr->windowSize = 0;
  zfhPtr->blockSizeMax = 0;
  zfhPtr->frameType = ZSTD_frame;
  zfhPtr->headerSize = 0;
  zfhPtr->dictID = 0;
  *(undefined8 *)&zfhPtr->checksumFlag = 0;
  sVar3 = uVar8;
  if (uVar8 <= srcSize) {
    if (src == (void *)0x0) {
      sVar3 = 0xffffffffffffffff;
    }
    else {
      format_00 = ZSTD_f_zstd1_magicless;
      if ((format == ZSTD_f_zstd1_magicless) || (format_00 = format, *src == 0xfd2fb528)) {
        sVar3 = ZSTD_frameHeaderSize_internal(src,srcSize,format_00);
        if (sVar3 <= srcSize) {
          zfhPtr->headerSize = (uint)sVar3;
          bVar1 = *(byte *)((long)src + lVar6);
          sVar3 = 0xfffffffffffffff2;
          if ((bVar1 & 8) == 0) {
            if ((bVar1 & 0x20) == 0) {
              bVar2 = *(byte *)((long)src + uVar8);
              if (0xaf < bVar2) {
                return 0xfffffffffffffff0;
              }
              uVar8 = lVar6 + 2;
              uVar4 = 1L << (bVar2 >> 3) + 10;
              lVar6 = (ulong)(bVar2 & 7) * (uVar4 >> 3) + uVar4;
            }
            else {
              lVar6 = 0;
            }
            uVar5 = bVar1 & 3;
            uVar7 = (uint)(bVar1 >> 6);
            switch(uVar5) {
            case 1:
              sVar3 = (*(code *)(&DAT_0019f548 + *(int *)(&DAT_0019f548 + (ulong)uVar7 * 4)))
                                (&DAT_0019f548 + *(int *)(&DAT_0019f548 + (ulong)uVar7 * 4),lVar6,
                                 bVar1,*(undefined1 *)((long)src + uVar8));
              return sVar3;
            case 2:
              sVar3 = (*(code *)(&DAT_0019f548 + *(int *)(&DAT_0019f548 + (ulong)uVar7 * 4)))
                                (&DAT_0019f548 + *(int *)(&DAT_0019f548 + (ulong)uVar7 * 4),lVar6,
                                 bVar1,*(undefined2 *)((long)src + uVar8));
              return sVar3;
            case 3:
              uVar5 = *(uint *)((long)src + uVar8);
            }
            sVar3 = (*(code *)(&DAT_0019f548 + *(int *)(&DAT_0019f548 + (ulong)uVar7 * 4)))
                              (&DAT_0019f548 + *(int *)(&DAT_0019f548 + (ulong)uVar7 * 4),lVar6,
                               bVar1,uVar5);
            return sVar3;
          }
        }
      }
      else {
        sVar3 = 0xfffffffffffffff6;
        if (((*src & 0xfffffff0) == 0x184d2a50) && (sVar3 = 8, 7 < srcSize)) {
          zfhPtr->frameContentSize = (ulong)*(uint *)((long)src + 4);
          zfhPtr->frameType = ZSTD_skippableFrame;
          sVar3 = 0;
        }
      }
    }
  }
  return sVar3;
}

Assistant:

size_t ZSTD_getFrameHeader_advanced(ZSTD_frameHeader* zfhPtr, const void* src, size_t srcSize, ZSTD_format_e format)
{
    const BYTE* ip = (const BYTE*)src;
    size_t const minInputSize = ZSTD_startingInputLength(format);

    memset(zfhPtr, 0, sizeof(*zfhPtr));   /* not strictly necessary, but static analyzer do not understand that zfhPtr is only going to be read only if return value is zero, since they are 2 different signals */
    if (srcSize < minInputSize) return minInputSize;
    RETURN_ERROR_IF(src==NULL, GENERIC, "invalid parameter");

    if ( (format != ZSTD_f_zstd1_magicless)
      && (MEM_readLE32(src) != ZSTD_MAGICNUMBER) ) {
        if ((MEM_readLE32(src) & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {
            /* skippable frame */
            if (srcSize < ZSTD_SKIPPABLEHEADERSIZE)
                return ZSTD_SKIPPABLEHEADERSIZE; /* magic number + frame length */
            memset(zfhPtr, 0, sizeof(*zfhPtr));
            zfhPtr->frameContentSize = MEM_readLE32((const char *)src + ZSTD_FRAMEIDSIZE);
            zfhPtr->frameType = ZSTD_skippableFrame;
            return 0;
        }
        RETURN_ERROR(prefix_unknown);
    }

    /* ensure there is enough `srcSize` to fully read/decode frame header */
    {   size_t const fhsize = ZSTD_frameHeaderSize_internal(src, srcSize, format);
        if (srcSize < fhsize) return fhsize;
        zfhPtr->headerSize = (U32)fhsize;
    }

    {   BYTE const fhdByte = ip[minInputSize-1];
        size_t pos = minInputSize;
        U32 const dictIDSizeCode = fhdByte&3;
        U32 const checksumFlag = (fhdByte>>2)&1;
        U32 const singleSegment = (fhdByte>>5)&1;
        U32 const fcsID = fhdByte>>6;
        U64 windowSize = 0;
        U32 dictID = 0;
        U64 frameContentSize = ZSTD_CONTENTSIZE_UNKNOWN;
        RETURN_ERROR_IF((fhdByte & 0x08) != 0, frameParameter_unsupported,
                        "reserved bits, must be zero");

        if (!singleSegment) {
            BYTE const wlByte = ip[pos++];
            U32 const windowLog = (wlByte >> 3) + ZSTD_WINDOWLOG_ABSOLUTEMIN;
            RETURN_ERROR_IF(windowLog > ZSTD_WINDOWLOG_MAX, frameParameter_windowTooLarge);
            windowSize = (1ULL << windowLog);
            windowSize += (windowSize >> 3) * (wlByte&7);
        }
        switch(dictIDSizeCode)
        {
            default: assert(0);  /* impossible */
            case 0 : break;
            case 1 : dictID = ip[pos]; pos++; break;
            case 2 : dictID = MEM_readLE16(ip+pos); pos+=2; break;
            case 3 : dictID = MEM_readLE32(ip+pos); pos+=4; break;
        }
        switch(fcsID)
        {
            default: assert(0);  /* impossible */
            case 0 : if (singleSegment) frameContentSize = ip[pos]; break;
            case 1 : frameContentSize = MEM_readLE16(ip+pos)+256; break;
            case 2 : frameContentSize = MEM_readLE32(ip+pos); break;
            case 3 : frameContentSize = MEM_readLE64(ip+pos); break;
        }
        if (singleSegment) windowSize = frameContentSize;

        zfhPtr->frameType = ZSTD_frame;
        zfhPtr->frameContentSize = frameContentSize;
        zfhPtr->windowSize = windowSize;
        zfhPtr->blockSizeMax = (unsigned) MIN(windowSize, ZSTD_BLOCKSIZE_MAX);
        zfhPtr->dictID = dictID;
        zfhPtr->checksumFlag = checksumFlag;
    }
    return 0;
}